

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ItemInputable(ImGuiWindow_conflict *window,ImGuiID id)

{
  byte *pbVar1;
  uint uVar2;
  ImGuiContext_conflict1 *pIVar3;
  ImGuiContext_conflict1 *pIVar4;
  int iVar5;
  bool bVar6;
  
  pIVar4 = GImGui;
  if ((id == 0) || ((GImGui->LastItemData).ID != id)) {
    __assert_fail("id != 0 && id == g.LastItemData.ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0xd25,"void ImGui::ItemInputable(ImGuiWindow *, ImGuiID)");
  }
  uVar2 = (GImGui->LastItemData).InFlags;
  if ((uVar2 & 5) == 0) {
    iVar5 = (window->DC).FocusCounterTabStop + 1;
    (window->DC).FocusCounterTabStop = iVar5;
    if (pIVar4->NavId == id) {
      pIVar4->NavIdTabCounter = iVar5;
    }
  }
  if (((pIVar4->ActiveId == id) && (pIVar4->TabFocusPressed == true)) &&
     (pIVar4->TabFocusRequestNextWindow == (ImGuiWindow_conflict *)0x0)) {
    pIVar4->TabFocusRequestNextWindow = window;
    iVar5 = 1;
    if ((pIVar4->IO).KeyShift != false) {
      iVar5 = -(uint)((uVar2 & 5) == 0);
    }
    pIVar4->TabFocusRequestNextCounterTabStop = iVar5 + (window->DC).FocusCounterTabStop;
  }
  pIVar3 = GImGui;
  if (pIVar4->TabFocusRequestCurrWindow == window) {
    if (((uVar2 & 5) == 0) &&
       ((window->DC).FocusCounterTabStop == pIVar4->TabFocusRequestCurrCounterTabStop)) {
      pIVar4->NavJustTabbedId = id;
      pbVar1 = (byte *)((long)&(pIVar4->LastItemData).StatusFlags + 1);
      *pbVar1 = *pbVar1 | 1;
      return;
    }
    if (pIVar4->ActiveId == id) {
      bVar6 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar6;
      if (bVar6) {
        pIVar3->ActiveIdTimer = 0.0;
        pIVar3->ActiveIdHasBeenPressedBefore = false;
        pIVar3->ActiveIdHasBeenEditedBefore = false;
        pIVar3->ActiveIdMouseButton = -1;
      }
      pIVar3->ActiveId = 0;
      pIVar3->ActiveIdAllowOverlap = false;
      pIVar3->ActiveIdNoClearOnFocusLoss = false;
      pIVar3->ActiveIdWindow = (ImGuiWindow_conflict *)0x0;
      pIVar3->ActiveIdHasBeenEditedThisFrame = false;
      pIVar3->ActiveIdUsingMouseWheel = false;
      pIVar3->ActiveIdUsingNavDirMask = 0;
      pIVar3->ActiveIdUsingNavInputMask = 0;
      pIVar3->ActiveIdUsingKeyInputMask = 0;
      return;
    }
  }
  return;
}

Assistant:

void ImGui::ItemInputable(ImGuiWindow* window, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0 && id == g.LastItemData.ID);

    // Increment counters
    // FIXME: ImGuiItemFlags_Disabled should disable more.
    const bool is_tab_stop = (g.LastItemData.InFlags & (ImGuiItemFlags_NoTabStop | ImGuiItemFlags_Disabled)) == 0;
    if (is_tab_stop)
    {
        window->DC.FocusCounterTabStop++;
        if (g.NavId == id)
            g.NavIdTabCounter = window->DC.FocusCounterTabStop;
    }

    // Process TAB/Shift-TAB to tab *OUT* of the currently focused item.
    // (Note that we can always TAB out of a widget that doesn't allow tabbing in)
    if (g.ActiveId == id && g.TabFocusPressed && g.TabFocusRequestNextWindow == NULL)
    {
        g.TabFocusRequestNextWindow = window;
        g.TabFocusRequestNextCounterTabStop = window->DC.FocusCounterTabStop + (g.IO.KeyShift ? (is_tab_stop ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.
    }

    // Handle focus requests
    if (g.TabFocusRequestCurrWindow == window)
    {
        if (is_tab_stop && window->DC.FocusCounterTabStop == g.TabFocusRequestCurrCounterTabStop)
        {
            g.NavJustTabbedId = id; // FIXME-NAV: aim to eventually set in NavUpdate() once we finish the refactor
            g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_FocusedByTabbing;
            return;
        }

        // If another item is about to be focused, we clear our own active id
        if (g.ActiveId == id)
            ClearActiveID();
    }
}